

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# medfilt.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  long in_RSI;
  int in_EDI;
  bool bVar5;
  ostringstream error_message_9;
  vector<double,_std::allocator<double>_> output;
  int output_length;
  ostringstream error_message_8;
  MedianFilter median_filter;
  InputSourceFromStream input_source;
  int input_length;
  istream *input_stream;
  ostringstream error_message_7;
  ifstream ifs;
  ostringstream error_message_6;
  char *input_file;
  ostringstream error_message_5;
  int num_input_files;
  ostringstream error_message_4;
  ostringstream error_message_3;
  int tmp;
  int max;
  int min;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  option long_options [2];
  bool is_magic_number_specified;
  double magic_number;
  WaysToApplyFilter way_to_apply_filter;
  int num_filter_order;
  int num_input_order;
  option *in_stack_ffffffffffffe9b8;
  allocator *paVar6;
  undefined6 in_stack_ffffffffffffe9c0;
  undefined1 in_stack_ffffffffffffe9c6;
  undefined1 in_stack_ffffffffffffe9c7;
  string *in_stack_ffffffffffffe9c8;
  InputSourceFromStream *in_stack_ffffffffffffe9d0;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffe9d8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe9e0;
  ostream *in_stack_ffffffffffffe9f0;
  int *actual_write_size;
  undefined7 in_stack_ffffffffffffe9f8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffea00;
  undefined8 in_stack_ffffffffffffea08;
  int in_stack_ffffffffffffea10;
  double in_stack_ffffffffffffea30;
  ostringstream *poVar7;
  char *pcVar8;
  undefined2 uVar9;
  InputSourceInterface *in_stack_ffffffffffffea40;
  undefined8 in_stack_ffffffffffffea48;
  MedianFilter *in_stack_ffffffffffffea50;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffeaa0;
  undefined4 in_stack_ffffffffffffeaa8;
  byte in_stack_ffffffffffffeaac;
  undefined1 in_stack_ffffffffffffeaad;
  byte in_stack_ffffffffffffeaae;
  undefined1 in_stack_ffffffffffffeaaf;
  bool local_14f2;
  bool local_14ca;
  allocator local_14b1;
  string local_14b0 [32];
  ostringstream local_1490 [56];
  ostringstream *in_stack_ffffffffffffeba8;
  string *in_stack_ffffffffffffebb0;
  allocator_type local_1311 [25];
  int local_12f8;
  allocator local_12f1;
  string local_12f0 [32];
  ostringstream local_12d0 [376];
  MedianFilter local_1158;
  int local_107c;
  int *local_1078;
  undefined4 local_1070;
  allocator local_1069;
  string local_1068 [32];
  ostringstream local_1048 [376];
  int local_ed0 [131];
  allocator local_cc1;
  string local_cc0 [32];
  ostringstream local_ca0 [376];
  char *local_b28;
  allocator local_b19;
  string local_b18 [32];
  ostringstream local_af8 [376];
  int local_980;
  allocator local_979;
  string local_978 [32];
  ostringstream local_958 [383];
  allocator local_7d9;
  string local_7d8 [39];
  allocator local_7b1;
  string local_7b0 [32];
  ostringstream local_790 [383];
  allocator local_611;
  string local_610 [32];
  int local_5f0;
  undefined4 local_5ec;
  undefined4 local_5e8;
  allocator local_5e1;
  string local_5e0 [32];
  ostringstream local_5c0 [383];
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [32];
  ostringstream local_3f8 [383];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [32];
  ostringstream local_230 [399];
  allocator local_a1;
  string local_a0 [36];
  int local_7c;
  undefined1 local_78 [79];
  undefined1 local_29;
  undefined8 local_28;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0;
  local_18 = 2;
  local_1c = 0;
  local_28 = 0;
  local_29 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memcpy(local_78,&PTR_anon_var_dwarf_1db2_0012abc0,0x40);
  while (local_7c = ya_getopt_long_only((int)((ulong)in_stack_ffffffffffffe9d0 >> 0x20),
                                        (char **)in_stack_ffffffffffffe9c8,
                                        (char *)CONCAT17(in_stack_ffffffffffffe9c7,
                                                         CONCAT16(in_stack_ffffffffffffe9c6,
                                                                  in_stack_ffffffffffffe9c0)),
                                        in_stack_ffffffffffffe9b8,(int *)0x103797),
        pcVar8 = ya_optarg, local_7c != -1) {
    if (local_7c == 0x68) {
      anon_unknown.dwarf_1d54::PrintUsage(in_stack_ffffffffffffe9f0);
      return 0;
    }
    if (local_7c == 0x6b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_440,pcVar8,&local_441);
      bVar1 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe9c8,
                         (int *)CONCAT17(in_stack_ffffffffffffe9c7,
                                         CONCAT16(in_stack_ffffffffffffe9c6,
                                                  in_stack_ffffffffffffe9c0)));
      bVar5 = local_18 < 0;
      std::__cxx11::string::~string(local_440);
      std::allocator<char>::~allocator((allocator<char> *)&local_441);
      if (!bVar1 || bVar5) {
        std::__cxx11::ostringstream::ostringstream(local_5c0);
        poVar4 = std::operator<<((ostream *)local_5c0,"The argument for the -k option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5e0,"medfilt",&local_5e1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
        std::__cxx11::string::~string(local_5e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_5c0);
        return local_4;
      }
    }
    else if (local_7c == 0x6c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,pcVar8,&local_a1);
      bVar1 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe9c8,
                         (int *)CONCAT17(in_stack_ffffffffffffe9c7,
                                         CONCAT16(in_stack_ffffffffffffe9c6,
                                                  in_stack_ffffffffffffe9c0)));
      local_14ca = !bVar1 || local_14 < 1;
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      if (local_14ca) {
        std::__cxx11::ostringstream::ostringstream(local_230);
        std::operator<<((ostream *)local_230,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_250,"medfilt",&local_251);
        sptk::PrintErrorMessage(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
        std::__cxx11::string::~string(local_250);
        std::allocator<char>::~allocator((allocator<char> *)&local_251);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_230);
        return local_4;
      }
      local_14 = local_14 + -1;
    }
    else if (local_7c == 0x6d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_278,pcVar8,&local_279);
      bVar1 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe9c8,
                         (int *)CONCAT17(in_stack_ffffffffffffe9c7,
                                         CONCAT16(in_stack_ffffffffffffe9c6,
                                                  in_stack_ffffffffffffe9c0)));
      local_14f2 = !bVar1 || local_14 < 0;
      std::__cxx11::string::~string(local_278);
      std::allocator<char>::~allocator((allocator<char> *)&local_279);
      if (local_14f2) {
        std::__cxx11::ostringstream::ostringstream(local_3f8);
        poVar4 = std::operator<<((ostream *)local_3f8,"The argument for the -m option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_418,"medfilt",&local_419);
        sptk::PrintErrorMessage(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
        std::__cxx11::string::~string(local_418);
        std::allocator<char>::~allocator((allocator<char> *)&local_419);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3f8);
        return local_4;
      }
    }
    else if (local_7c == 0x77) {
      local_5e8 = 0;
      local_5ec = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_610,pcVar8,&local_611);
      in_stack_ffffffffffffeaaf =
           sptk::ConvertStringToInteger
                     (in_stack_ffffffffffffe9c8,
                      (int *)CONCAT17(in_stack_ffffffffffffe9c7,
                                      CONCAT16(in_stack_ffffffffffffe9c6,in_stack_ffffffffffffe9c0))
                     );
      in_stack_ffffffffffffeaac = 1;
      if ((bool)in_stack_ffffffffffffeaaf) {
        in_stack_ffffffffffffeaad = sptk::IsInRange(local_5f0,0,1);
        in_stack_ffffffffffffeaac = in_stack_ffffffffffffeaad ^ 0xff;
      }
      in_stack_ffffffffffffeaae = in_stack_ffffffffffffeaac;
      std::__cxx11::string::~string(local_610);
      std::allocator<char>::~allocator((allocator<char> *)&local_611);
      if ((in_stack_ffffffffffffeaac & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_790);
        poVar4 = std::operator<<((ostream *)local_790,
                                 "The argument for the -w option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_7b0,"medfilt",&local_7b1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
        std::__cxx11::string::~string(local_7b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_790);
        return local_4;
      }
      local_1c = local_5f0;
    }
    else {
      if (local_7c != 1000) {
        anon_unknown.dwarf_1d54::PrintUsage(in_stack_ffffffffffffe9f0);
        return 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7d8,pcVar8,&local_7d9);
      bVar1 = sptk::ConvertStringToDouble
                        (in_stack_ffffffffffffe9c8,
                         (double *)
                         CONCAT17(in_stack_ffffffffffffe9c7,
                                  CONCAT16(in_stack_ffffffffffffe9c6,in_stack_ffffffffffffe9c0)));
      std::__cxx11::string::~string(local_7d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_958);
        std::operator<<((ostream *)local_958,"The argument for the -magic option must be a number");
        paVar6 = &local_979;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_978,"medfilt",paVar6);
        sptk::PrintErrorMessage(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
        std::__cxx11::string::~string(local_978);
        std::allocator<char>::~allocator((allocator<char> *)&local_979);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_958);
        return local_4;
      }
      local_29 = 1;
    }
  }
  local_980 = local_8 - ya_optind;
  if (1 < local_980) {
    poVar7 = local_af8;
    std::__cxx11::ostringstream::ostringstream(poVar7);
    std::operator<<((ostream *)poVar7,"Too many input files");
    paVar6 = &local_b19;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b18,"medfilt",paVar6);
    sptk::PrintErrorMessage(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
    std::__cxx11::string::~string(local_b18);
    std::allocator<char>::~allocator((allocator<char> *)&local_b19);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_af8);
    return local_4;
  }
  if (local_980 == 0) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_b28 = pcVar8;
  bVar1 = sptk::SetBinaryMode();
  uVar9 = (undefined2)((ulong)pcVar8 >> 0x30);
  if (!bVar1) {
    poVar7 = local_ca0;
    std::__cxx11::ostringstream::ostringstream(poVar7);
    std::operator<<((ostream *)poVar7,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cc0,"medfilt",&local_cc1);
    sptk::PrintErrorMessage(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
    std::__cxx11::string::~string(local_cc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_ca0);
    return local_4;
  }
  std::ifstream::ifstream(local_ed0);
  pcVar8 = local_b28;
  if (local_b28 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)local_ed0,(_Ios_Openmode)pcVar8);
    bVar2 = std::ios::fail();
    if ((bVar2 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1048);
      poVar4 = std::operator<<((ostream *)local_1048,"Cannot open file ");
      std::operator<<(poVar4,local_b28);
      paVar6 = &local_1069;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1068,"medfilt",paVar6);
      sptk::PrintErrorMessage(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
      std::__cxx11::string::~string(local_1068);
      std::allocator<char>::~allocator((allocator<char> *)&local_1069);
      local_4 = 1;
      local_1070 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1048);
      goto LAB_00104d2d;
    }
  }
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    actual_write_size = (int *)&std::cin;
  }
  else {
    actual_write_size = local_ed0;
  }
  local_107c = local_14 + 1;
  local_1078 = actual_write_size;
  sptk::InputSourceFromStream::InputSourceFromStream
            (in_stack_ffffffffffffe9d0,SUB81((ulong)in_stack_ffffffffffffe9c8 >> 0x38,0),
             (int)in_stack_ffffffffffffe9c8,
             (istream *)
             CONCAT17(in_stack_ffffffffffffe9c7,
                      CONCAT16(in_stack_ffffffffffffe9c6,in_stack_ffffffffffffe9c0)));
  sptk::MedianFilter::MedianFilter
            (in_stack_ffffffffffffea50,(int)((ulong)in_stack_ffffffffffffea48 >> 0x20),
             (int)in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,SUB21((ushort)uVar9 >> 8,0),
             SUB21(uVar9,0),in_stack_ffffffffffffea30);
  bVar1 = sptk::MedianFilter::IsValid(&local_1158);
  if (bVar1) {
    iVar3 = sptk::MedianFilter::GetSize(&local_1158);
    __a = local_1311;
    local_12f8 = iVar3;
    std::allocator<double>::allocator((allocator<double> *)0x104ae9);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffe9e0,CONCAT44(iVar3,in_stack_ffffffffffffe9d8),__a);
    std::allocator<double>::~allocator((allocator<double> *)0x104b0f);
    do {
      in_stack_ffffffffffffe9c7 =
           sptk::MedianFilter::Get
                     ((MedianFilter *)
                      CONCAT17(in_stack_ffffffffffffeaaf,
                               CONCAT16(in_stack_ffffffffffffeaae,
                                        CONCAT15(in_stack_ffffffffffffeaad,
                                                 CONCAT14(in_stack_ffffffffffffeaac,
                                                          in_stack_ffffffffffffeaa8)))),
                      in_stack_ffffffffffffeaa0);
      if (!(bool)in_stack_ffffffffffffe9c7) {
        local_4 = 0;
        local_1070 = 1;
        goto LAB_00104cd7;
      }
      in_stack_ffffffffffffe9c6 =
           sptk::WriteStream<double>
                     (in_stack_ffffffffffffea10,(int)((ulong)in_stack_ffffffffffffea08 >> 0x20),
                      in_stack_ffffffffffffea00,(ostream *)CONCAT17(bVar2,in_stack_ffffffffffffe9f8)
                      ,actual_write_size);
    } while ((bool)in_stack_ffffffffffffe9c6);
    std::__cxx11::ostringstream::ostringstream(local_1490);
    std::operator<<((ostream *)local_1490,"Failed to write output");
    paVar6 = &local_14b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_14b0,"medfilt",paVar6);
    sptk::PrintErrorMessage(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
    std::__cxx11::string::~string(local_14b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_14b1);
    local_4 = 1;
    local_1070 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1490);
LAB_00104cd7:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)__a);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_12d0);
    std::operator<<((ostream *)local_12d0,"Failed to initialize MedianFilter");
    paVar6 = &local_12f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_12f0,"medfilt",paVar6);
    sptk::PrintErrorMessage(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
    std::__cxx11::string::~string(local_12f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_12f1);
    local_4 = 1;
    local_1070 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_12d0);
  }
  sptk::MedianFilter::~MedianFilter
            ((MedianFilter *)
             CONCAT17(in_stack_ffffffffffffe9c7,
                      CONCAT16(in_stack_ffffffffffffe9c6,in_stack_ffffffffffffe9c0)));
  sptk::InputSourceFromStream::~InputSourceFromStream((InputSourceFromStream *)0x104d0f);
LAB_00104d2d:
  std::ifstream::~ifstream(local_ed0);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_input_order(kDefaultNumInputOrder);
  int num_filter_order(kDefaultNumFilterOrder);
  WaysToApplyFilter way_to_apply_filter(kDefaultWayToApplyFilter);
  double magic_number(0.0);
  bool is_magic_number_specified(false);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:k:w:h", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_input_order) ||
            num_input_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        --num_input_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_input_order) ||
            num_input_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        break;
      }
      case 'k': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -k option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        break;
      }
      case 'w': {
        const int min(0);
        const int max(static_cast<int>(kNumWaysToApplyFilter) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -w option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        way_to_apply_filter = static_cast<WaysToApplyFilter>(tmp);
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -magic option must be a number";
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        is_magic_number_specified = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("medfilt", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("medfilt", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("medfilt", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const int input_length(num_input_order + 1);
  sptk::InputSourceFromStream input_source(false, input_length, &input_stream);
  sptk::MedianFilter median_filter(num_input_order, num_filter_order,
                                   &input_source,
                                   kEachDimension == way_to_apply_filter,
                                   is_magic_number_specified, magic_number);
  if (!median_filter.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize MedianFilter";
    sptk::PrintErrorMessage("medfilt", error_message);
    return 1;
  }

  const int output_length(median_filter.GetSize());
  std::vector<double> output(output_length);

  while (median_filter.Get(&output)) {
    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write output";
      sptk::PrintErrorMessage("medfilt", error_message);
      return 1;
    }
  }

  return 0;
}